

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_emit_node
              (yaml_emitter_t *emitter,yaml_event_t *event,int root,int sequence,int mapping,
              int simple_key)

{
  yaml_break_t yVar1;
  yaml_emitter_state_t *pyVar2;
  size_t sVar3;
  byte *pbVar4;
  int *piVar5;
  yaml_string_t string;
  yaml_string_t string_00;
  char cVar6;
  yaml_char_t yVar7;
  byte bVar8;
  yaml_scalar_style_t yVar9;
  int iVar10;
  yaml_emitter_state_t yVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  yaml_char_t *pyVar15;
  yaml_char_t *pyVar16;
  yaml_emitter_state_t yVar17;
  long lVar18;
  byte *pbVar19;
  ulong uVar20;
  bool bVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  byte *pbVar25;
  uint uVar26;
  bool bVar27;
  ulong uStackY_80;
  
  emitter->root_context = root;
  emitter->sequence_context = sequence;
  emitter->mapping_context = mapping;
  emitter->simple_key_context = simple_key;
  switch(event->type) {
  case YAML_ALIAS_EVENT:
    iVar10 = yaml_emitter_process_anchor(emitter);
    if (iVar10 == 0) {
      return 0;
    }
    pyVar2 = (emitter->states).top;
    (emitter->states).top = pyVar2 + -1;
    yVar11 = pyVar2[-1];
    goto LAB_00108d93;
  case YAML_SCALAR_EVENT:
    yVar9 = (event->data).scalar.style;
    if (((emitter->tag_data).handle == (yaml_char_t *)0x0) &&
       ((emitter->tag_data).suffix == (yaml_char_t *)0x0)) {
      bVar27 = true;
      if (((event->data).scalar.plain_implicit == 0) && ((event->data).scalar.quoted_implicit == 0))
      {
        emitter->error = YAML_EMITTER_ERROR;
        pcVar14 = "neither tag nor implicit flags are specified";
        goto LAB_00108dab;
      }
    }
    else {
      bVar27 = false;
    }
    yVar9 = yVar9 + (yVar9 == YAML_ANY_SCALAR_STYLE);
    if (emitter->canonical != 0) {
      yVar9 = YAML_DOUBLE_QUOTED_SCALAR_STYLE;
    }
    if ((simple_key == 0) || ((emitter->scalar_data).multiline == 0)) {
      if (yVar9 == YAML_PLAIN_SCALAR_STYLE) {
        sVar3 = (emitter->scalar_data).length;
        if (emitter->flow_level == 0) {
          yVar9 = ((emitter->scalar_data).block_plain_allowed == 0) + YAML_PLAIN_SCALAR_STYLE;
          if (simple_key != 0 && sVar3 == 0) goto LAB_0010876f;
        }
        else {
          yVar9 = ((emitter->scalar_data).flow_plain_allowed == 0) + YAML_PLAIN_SCALAR_STYLE;
          if (sVar3 == 0) {
LAB_0010876f:
            yVar9 = YAML_SINGLE_QUOTED_SCALAR_STYLE;
          }
        }
        if ((!bVar27) || ((event->data).scalar.plain_implicit != 0)) goto LAB_0010877d;
LAB_00108782:
        yVar9 = ((emitter->scalar_data).single_quoted_allowed == 0) +
                YAML_SINGLE_QUOTED_SCALAR_STYLE;
      }
      else {
LAB_0010877d:
        if (yVar9 == YAML_SINGLE_QUOTED_SCALAR_STYLE) goto LAB_00108782;
      }
      if (((yVar9 & ~YAML_PLAIN_SCALAR_STYLE) == YAML_LITERAL_SCALAR_STYLE) &&
         (((emitter->scalar_data).block_allowed == 0 ||
          (simple_key != 0 || emitter->flow_level != 0)))) goto LAB_001087aa;
    }
    else {
LAB_001087aa:
      yVar9 = YAML_DOUBLE_QUOTED_SCALAR_STYLE;
    }
    if (((bVar27) && (yVar9 != YAML_PLAIN_SCALAR_STYLE)) &&
       ((event->data).scalar.quoted_implicit == 0)) {
      (emitter->tag_data).handle = "!";
      (emitter->tag_data).handle_length = 1;
    }
    (emitter->scalar_data).style = yVar9;
    iVar10 = yaml_emitter_process_anchor(emitter);
    if (iVar10 == 0) {
      return 0;
    }
    iVar10 = yaml_emitter_process_tag(emitter);
    if (iVar10 == 0) {
      return 0;
    }
    iVar10 = yaml_emitter_increase_indent(emitter,1,0);
    if (iVar10 == 0) {
      return 0;
    }
    switch((emitter->scalar_data).style) {
    case YAML_PLAIN_SCALAR_STYLE:
      pbVar25 = (emitter->scalar_data).value;
      iVar10 = emitter->simple_key_context;
      pbVar19 = pbVar25 + (emitter->scalar_data).length;
      if (emitter->whitespace == 0) {
        pyVar16 = (emitter->buffer).pointer;
        if ((emitter->buffer).end <= pyVar16 + 5) {
          iVar12 = yaml_emitter_flush(emitter);
          if (iVar12 == 0) {
            return 0;
          }
          pyVar16 = (emitter->buffer).pointer;
        }
        (emitter->buffer).pointer = pyVar16 + 1;
        *pyVar16 = ' ';
        emitter->column = emitter->column + 1;
      }
      do {
        bVar21 = false;
        bVar27 = false;
LAB_001088a1:
        while( true ) {
          if (pbVar25 == pbVar19) {
            emitter->whitespace = 0;
            emitter->indention = 0;
            if (emitter->root_context != 0) {
              emitter->open_ended = 1;
            }
            goto LAB_0010a700;
          }
          bVar8 = *pbVar25;
          if ((bVar8 != 10) && (bVar8 != 0xd)) break;
LAB_001088f2:
          pyVar16 = (emitter->buffer).end;
          pyVar15 = (emitter->buffer).pointer;
          if ((!bVar27) && (bVar8 == 10)) {
            if ((pyVar16 <= pyVar15 + 5) && (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)) {
              return 0;
            }
            yVar1 = emitter->line_break;
            if (yVar1 == YAML_CR_BREAK) {
              yVar7 = '\r';
LAB_00108948:
              pyVar16 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar16 + 1;
              *pyVar16 = yVar7;
            }
            else {
              if (yVar1 == YAML_CRLN_BREAK) {
                pyVar16 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar16 + 1;
                *pyVar16 = '\r';
LAB_00108942:
                yVar7 = '\n';
                goto LAB_00108948;
              }
              if (yVar1 == YAML_LN_BREAK) goto LAB_00108942;
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
            pyVar16 = (emitter->buffer).end;
            pyVar15 = (emitter->buffer).pointer;
          }
          if ((pyVar16 <= pyVar15 + 5) && (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)) {
            return 0;
          }
          bVar8 = *pbVar25;
          if (bVar8 == 10) {
            if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
               (iVar12 = yaml_emitter_flush(emitter), iVar12 != 0)) {
              yVar1 = emitter->line_break;
              if (yVar1 == YAML_CR_BREAK) {
                yVar7 = '\r';
LAB_00108a07:
                pyVar16 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar16 + 1;
                *pyVar16 = yVar7;
              }
              else {
                if (yVar1 == YAML_CRLN_BREAK) {
                  pyVar16 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar16 + 1;
                  *pyVar16 = '\r';
LAB_00108a01:
                  yVar7 = '\n';
                  goto LAB_00108a07;
                }
                if (yVar1 == YAML_LN_BREAK) goto LAB_00108a01;
              }
              emitter->column = 0;
              emitter->line = emitter->line + 1;
            }
            pbVar25 = pbVar25 + 1;
          }
          else {
            if ((char)bVar8 < '\0') {
              if ((bVar8 & 0xe0) == 0xc0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[1];
                pbVar25 = pbVar25 + 2;
                goto LAB_00108aa8;
              }
              if ((bVar8 & 0xf0) == 0xe0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[2];
                pbVar25 = pbVar25 + 3;
                goto LAB_00108aa8;
              }
              if ((bVar8 & 0xf8) == 0xf0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[2];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[3];
                pbVar25 = pbVar25 + 4;
                goto LAB_00108aa8;
              }
            }
            else {
              pbVar25 = pbVar25 + 1;
LAB_00108aa8:
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
          }
          emitter->indention = 1;
          bVar27 = true;
        }
        if (bVar8 != 0xc2) {
          if ((bVar8 == 0xe2) || (bVar8 != 0x20)) goto LAB_00108c46;
          if ((bVar21 || iVar10 != 0) ||
             ((emitter->column <= emitter->best_width || (pbVar25[1] == 0x20)))) {
            bVar8 = 0x20;
            if ((emitter->buffer).pointer + 5 < (emitter->buffer).end) {
LAB_00108b21:
              pbVar25 = pbVar25 + 1;
LAB_00108b24:
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
            }
            else {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              bVar8 = *pbVar25;
              if (-1 < (char)bVar8) goto LAB_00108b21;
              if ((bVar8 & 0xe0) == 0xc0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[1];
                pbVar25 = pbVar25 + 2;
                goto LAB_00108b24;
              }
              if ((bVar8 & 0xf0) == 0xe0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[2];
                pbVar25 = pbVar25 + 3;
                goto LAB_00108b24;
              }
              if ((bVar8 & 0xf8) == 0xf0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[2];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar25[3];
                pbVar25 = pbVar25 + 4;
                goto LAB_00108b24;
              }
            }
            emitter->column = emitter->column + 1;
            bVar21 = true;
          }
          else {
            iVar12 = yaml_emitter_write_indent(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            bVar8 = *pbVar25;
            lVar18 = 1;
            if ((((char)bVar8 < '\0') && (lVar18 = 2, (bVar8 & 0xe0) != 0xc0)) &&
               (lVar18 = 3, (bVar8 & 0xf0) != 0xe0)) {
              lVar18 = (ulong)((bVar8 & 0xf8) == 0xf0) << 2;
            }
            pbVar25 = pbVar25 + lVar18;
            bVar21 = true;
          }
          goto LAB_001088a1;
        }
        if (pbVar25[1] == 0x85) goto LAB_001088f2;
LAB_00108c46:
        if ((bVar27) && (iVar12 = yaml_emitter_write_indent(emitter), iVar12 == 0)) {
          return 0;
        }
        if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
           (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)) {
          return 0;
        }
        bVar8 = *pbVar25;
        if ((char)bVar8 < '\0') {
          if ((bVar8 & 0xe0) == 0xc0) {
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[1];
            pbVar25 = pbVar25 + 2;
            goto LAB_00108d2c;
          }
          if ((bVar8 & 0xf0) == 0xe0) {
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[1];
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[2];
            pbVar25 = pbVar25 + 3;
            goto LAB_00108d2c;
          }
          if ((bVar8 & 0xf8) == 0xf0) {
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[1];
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[2];
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[3];
            pbVar25 = pbVar25 + 4;
            goto LAB_00108d2c;
          }
        }
        else {
          pbVar25 = pbVar25 + 1;
LAB_00108d2c:
          pbVar4 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar4 + 1;
          *pbVar4 = bVar8;
        }
        emitter->column = emitter->column + 1;
        emitter->indention = 0;
      } while( true );
    case YAML_SINGLE_QUOTED_SCALAR_STYLE:
      pbVar25 = (emitter->scalar_data).value;
      iVar10 = emitter->simple_key_context;
      sVar3 = (emitter->scalar_data).length;
      iVar12 = yaml_emitter_write_indicator(emitter,"\'",1,0,0);
      if (iVar12 == 0) {
        return 0;
      }
      pbVar19 = pbVar25;
      do {
        bVar21 = false;
        bVar27 = false;
LAB_00109985:
        if (pbVar19 == pbVar25 + sVar3) {
          if ((bVar27) && (iVar10 = yaml_emitter_write_indent(emitter), iVar10 == 0)) {
            return 0;
          }
          pcVar14 = "\'";
LAB_00109eef:
          iVar10 = yaml_emitter_write_indicator(emitter,pcVar14,0,0,0);
          if (iVar10 == 0) {
            return 0;
          }
          emitter->whitespace = 0;
          emitter->indention = 0;
          goto LAB_0010a700;
        }
        bVar8 = *pbVar19;
        if ((bVar8 == 10) || (bVar8 == 0xd)) {
LAB_001099da:
          pyVar16 = (emitter->buffer).end;
          pyVar15 = (emitter->buffer).pointer;
          if ((!bVar27) && (bVar8 == 10)) {
            if ((pyVar16 <= pyVar15 + 5) && (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)) {
              return 0;
            }
            yVar1 = emitter->line_break;
            if (yVar1 == YAML_CR_BREAK) {
              yVar7 = '\r';
LAB_00109a30:
              pyVar16 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar16 + 1;
              *pyVar16 = yVar7;
            }
            else {
              if (yVar1 == YAML_CRLN_BREAK) {
                pyVar16 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar16 + 1;
                *pyVar16 = '\r';
LAB_00109a2a:
                yVar7 = '\n';
                goto LAB_00109a30;
              }
              if (yVar1 == YAML_LN_BREAK) goto LAB_00109a2a;
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
            pyVar16 = (emitter->buffer).end;
            pyVar15 = (emitter->buffer).pointer;
          }
          if ((pyVar16 <= pyVar15 + 5) && (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)) {
            return 0;
          }
          bVar8 = *pbVar19;
          if (bVar8 == 10) {
            if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
               (iVar12 = yaml_emitter_flush(emitter), iVar12 != 0)) {
              yVar1 = emitter->line_break;
              if (yVar1 == YAML_CR_BREAK) {
                yVar7 = '\r';
LAB_00109af1:
                pyVar16 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar16 + 1;
                *pyVar16 = yVar7;
              }
              else {
                if (yVar1 == YAML_CRLN_BREAK) {
                  pyVar16 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar16 + 1;
                  *pyVar16 = '\r';
LAB_00109aeb:
                  yVar7 = '\n';
                  goto LAB_00109af1;
                }
                if (yVar1 == YAML_LN_BREAK) goto LAB_00109aeb;
              }
              emitter->column = 0;
              emitter->line = emitter->line + 1;
            }
            pbVar19 = pbVar19 + 1;
          }
          else {
            if ((char)bVar8 < '\0') {
              if ((bVar8 & 0xe0) == 0xc0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar19 = pbVar19 + 2;
                goto LAB_00109b97;
              }
              if ((bVar8 & 0xf0) == 0xe0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[2];
                pbVar19 = pbVar19 + 3;
                goto LAB_00109b97;
              }
              if ((bVar8 & 0xf8) == 0xf0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[2];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[3];
                pbVar19 = pbVar19 + 4;
                goto LAB_00109b97;
              }
            }
            else {
              pbVar19 = pbVar19 + 1;
LAB_00109b97:
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
          }
          emitter->indention = 1;
          bVar27 = true;
          goto LAB_00109985;
        }
        if (bVar8 != 0xc2) {
          if ((bVar8 == 0xe2) || (bVar8 != 0x20)) goto LAB_00109d55;
          if ((bVar21 || iVar10 != 0) ||
             (((pbVar19 == pbVar25 + sVar3 + -1 || pbVar19 == pbVar25) ||
               emitter->column <= emitter->best_width || (pbVar19[1] == 0x20)))) {
            bVar8 = 0x20;
            if ((emitter->buffer).pointer + 5 < (emitter->buffer).end) {
LAB_00109c29:
              pbVar19 = pbVar19 + 1;
LAB_00109c2c:
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
            }
            else {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              bVar8 = *pbVar19;
              if (-1 < (char)bVar8) goto LAB_00109c29;
              if ((bVar8 & 0xe0) == 0xc0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar19 = pbVar19 + 2;
                goto LAB_00109c2c;
              }
              if ((bVar8 & 0xf0) == 0xe0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[2];
                pbVar19 = pbVar19 + 3;
                goto LAB_00109c2c;
              }
              if ((bVar8 & 0xf8) == 0xf0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[2];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[3];
                pbVar19 = pbVar19 + 4;
                goto LAB_00109c2c;
              }
            }
            emitter->column = emitter->column + 1;
            bVar21 = true;
          }
          else {
            iVar12 = yaml_emitter_write_indent(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            bVar8 = *pbVar19;
            lVar18 = 1;
            if ((((char)bVar8 < '\0') && (lVar18 = 2, (bVar8 & 0xe0) != 0xc0)) &&
               (lVar18 = 3, (bVar8 & 0xf0) != 0xe0)) {
              lVar18 = (ulong)((bVar8 & 0xf8) == 0xf0) << 2;
            }
            pbVar19 = pbVar19 + lVar18;
            bVar21 = true;
          }
          goto LAB_00109985;
        }
        if (pbVar19[1] == 0x85) goto LAB_001099da;
LAB_00109d55:
        if (bVar27) {
          iVar12 = yaml_emitter_write_indent(emitter);
          if (iVar12 == 0) {
            return 0;
          }
          bVar8 = *pbVar19;
        }
        pyVar16 = (emitter->buffer).end;
        pyVar15 = (emitter->buffer).pointer;
        if (bVar8 == 0x27) {
          if (pyVar16 <= pyVar15 + 5) {
            iVar12 = yaml_emitter_flush(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            pyVar15 = (emitter->buffer).pointer;
          }
          (emitter->buffer).pointer = pyVar15 + 1;
          *pyVar15 = '\'';
          emitter->column = emitter->column + 1;
          pyVar16 = (emitter->buffer).end;
          pyVar15 = (emitter->buffer).pointer;
        }
        if ((pyVar16 <= pyVar15 + 5) && (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)) {
          return 0;
        }
        bVar8 = *pbVar19;
        if ((char)bVar8 < '\0') {
          if ((bVar8 & 0xe0) == 0xc0) {
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar19[1];
            pbVar19 = pbVar19 + 2;
            goto LAB_00109e86;
          }
          if ((bVar8 & 0xf0) == 0xe0) {
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar19[1];
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar19[2];
            pbVar19 = pbVar19 + 3;
            goto LAB_00109e86;
          }
          if ((bVar8 & 0xf8) == 0xf0) {
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar19[1];
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar19[2];
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar19[3];
            pbVar19 = pbVar19 + 4;
            goto LAB_00109e86;
          }
        }
        else {
          pbVar19 = pbVar19 + 1;
LAB_00109e86:
          pbVar4 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar4 + 1;
          *pbVar4 = bVar8;
        }
        emitter->column = emitter->column + 1;
        emitter->indention = 0;
      } while( true );
    case YAML_DOUBLE_QUOTED_SCALAR_STYLE:
      pbVar25 = (emitter->scalar_data).value;
      iVar10 = emitter->simple_key_context;
      sVar3 = (emitter->scalar_data).length;
      iVar12 = yaml_emitter_write_indicator(emitter,"\"",1,0,0);
      if (iVar12 == 0) {
        return 0;
      }
      pbVar19 = pbVar25;
      do {
        bVar27 = false;
LAB_00108f0a:
        while( true ) {
          if (pbVar19 == pbVar25 + sVar3) {
            pcVar14 = "\"";
            goto LAB_00109eef;
          }
          bVar8 = *pbVar19;
          uVar23 = (uint)bVar8;
          if (bVar8 == 10) goto LAB_00108f1e;
          uVar26 = (uint)bVar8;
          uVar24 = (uint)bVar8;
          if (0x5e < (byte)(bVar8 - 0x20)) break;
LAB_00108f9f:
          if (emitter->unicode == 0) {
            if ((char)bVar8 < '\0') goto LAB_001093ca;
            if ((uVar26 != 10) && (uVar26 != 0xd)) {
              if (uVar24 == 0x20) goto LAB_0010914b;
              if ((uVar24 != 0x22) && (uVar26 != 0x5c)) goto LAB_001094a5;
            }
LAB_00108f1e:
            uStackY_80 = 1;
            goto LAB_00108f22;
          }
          if ((uVar26 == 10) || (uVar24 == 0xd)) goto LAB_00108f1e;
          if (uVar24 != 0x20) {
            if ((uVar26 == 0x22) || (uVar26 == 0x5c)) goto LAB_00108f1e;
            if (uVar26 == 0xc2) {
              if (pbVar19[1] == 0x85) goto LAB_001093ca;
            }
            else if (((uVar26 != 0xe2) && (uVar26 == 0xef)) &&
                    ((pbVar19[1] == 0xbb && (pbVar19[2] == 0xbf)))) {
LAB_001093ca:
              if ((uVar26 & 0xffffffe0) == 0xc0) {
                uVar23 = uVar24 & 0x1f;
                uStackY_80 = 2;
              }
              else if ((uVar24 & 0xfffffff0) == 0xe0) {
                uVar23 = uVar26 & 0xf;
                uStackY_80 = 3;
              }
              else {
                bVar27 = (uVar24 & 0xfffffff8) == 0xf0;
                uVar23 = uVar26 & 7;
                if (!bVar27) {
                  uVar23 = 0;
                }
                uStackY_80 = (ulong)bVar27 << 2;
              }
              goto LAB_00108f22;
            }
LAB_001094a5:
            if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              bVar8 = *pbVar19;
            }
            if ((char)bVar8 < '\0') {
              if ((bVar8 & 0xe0) == 0xc0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar19 = pbVar19 + 2;
              }
              else if ((bVar8 & 0xf0) == 0xe0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[2];
                pbVar19 = pbVar19 + 3;
              }
              else {
                if ((bVar8 & 0xf8) != 0xf0) goto LAB_00109879;
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[2];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[3];
                pbVar19 = pbVar19 + 4;
              }
            }
            else {
              pbVar19 = pbVar19 + 1;
            }
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            goto LAB_00109879;
          }
LAB_0010914b:
          if ((bVar27 || iVar10 != 0) ||
             ((pbVar19 == pbVar25 + sVar3 + -1 || pbVar19 == pbVar25) ||
              emitter->column <= emitter->best_width)) {
            bVar8 = 0x20;
            if ((emitter->buffer).pointer + 5 < (emitter->buffer).end) {
LAB_001091a3:
              pbVar19 = pbVar19 + 1;
LAB_001091a6:
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
            }
            else {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              bVar8 = *pbVar19;
              if (-1 < (char)bVar8) goto LAB_001091a3;
              if ((bVar8 & 0xe0) == 0xc0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar19 = pbVar19 + 2;
                goto LAB_001091a6;
              }
              if ((bVar8 & 0xf0) == 0xe0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[2];
                pbVar19 = pbVar19 + 3;
                goto LAB_001091a6;
              }
              if ((bVar8 & 0xf8) == 0xf0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[2];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar8;
                bVar8 = pbVar19[3];
                pbVar19 = pbVar19 + 4;
                goto LAB_001091a6;
              }
            }
            emitter->column = emitter->column + 1;
            bVar27 = true;
          }
          else {
            iVar12 = yaml_emitter_write_indent(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            if (pbVar19[1] == 0x20) {
              pyVar16 = (emitter->buffer).pointer;
              if ((emitter->buffer).end <= pyVar16 + 5) {
                iVar12 = yaml_emitter_flush(emitter);
                if (iVar12 == 0) {
                  return 0;
                }
                pyVar16 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar16 + 1;
              *pyVar16 = '\\';
              emitter->column = emitter->column + 1;
            }
            bVar8 = *pbVar19;
            lVar18 = 1;
            if ((((char)bVar8 < '\0') && (lVar18 = 2, (bVar8 & 0xe0) != 0xc0)) &&
               (lVar18 = 3, (bVar8 & 0xf0) != 0xe0)) {
              lVar18 = (ulong)((bVar8 & 0xf8) == 0xf0) << 2;
            }
            pbVar19 = pbVar19 + lVar18;
            bVar27 = true;
          }
        }
        if (bVar8 == 0xc2) {
          if (pbVar19[1] < 0xa0) goto LAB_001093ca;
          goto LAB_00108f9f;
        }
        if ((byte)(bVar8 + 0x3d) < 0x2a) goto LAB_00108f9f;
        if (bVar8 == 0xef) {
          if (pbVar19[1] == 0xbf) {
            if ((pbVar19[2] & 0xfe) != 0xbe) goto LAB_00108f9f;
          }
          else if ((pbVar19[1] != 0xbb) || (pbVar19[2] != 0xbf)) goto LAB_00108f9f;
          goto LAB_001093ca;
        }
        if (uVar26 == 0xee) goto LAB_00108f9f;
        if (uVar26 == 0xed) {
          if (pbVar19[1] < 0xa0) goto LAB_00108f9f;
          goto LAB_001093ca;
        }
        uStackY_80 = 1;
        if ((char)bVar8 < '\0') goto LAB_001093ca;
LAB_00108f22:
        for (uVar20 = 1; uVar20 < uStackY_80; uVar20 = uVar20 + 1) {
          uVar23 = uVar23 << 6 | pbVar19[uVar20] & 0x3f;
        }
        pyVar16 = (emitter->buffer).pointer;
        if ((emitter->buffer).end <= pyVar16 + 5) {
          iVar12 = yaml_emitter_flush(emitter);
          if (iVar12 == 0) {
            return 0;
          }
          pyVar16 = (emitter->buffer).pointer;
        }
        pbVar19 = pbVar19 + uStackY_80;
        (emitter->buffer).pointer = pyVar16 + 1;
        *pyVar16 = '\\';
        emitter->column = emitter->column + 1;
        switch(uVar23) {
        case 0:
          pyVar16 = (emitter->buffer).pointer;
          if ((emitter->buffer).end <= pyVar16 + 5) {
            iVar12 = yaml_emitter_flush(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            pyVar16 = (emitter->buffer).pointer;
          }
          (emitter->buffer).pointer = pyVar16 + 1;
          *pyVar16 = '0';
LAB_00109879:
          emitter->column = emitter->column + 1;
          break;
        case 7:
          pyVar16 = (emitter->buffer).pointer;
          if ((emitter->buffer).end <= pyVar16 + 5) {
            iVar12 = yaml_emitter_flush(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            pyVar16 = (emitter->buffer).pointer;
          }
          (emitter->buffer).pointer = pyVar16 + 1;
          *pyVar16 = 'a';
          goto LAB_00109879;
        case 8:
          pyVar16 = (emitter->buffer).pointer;
          if ((emitter->buffer).end <= pyVar16 + 5) {
            iVar12 = yaml_emitter_flush(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            pyVar16 = (emitter->buffer).pointer;
          }
          (emitter->buffer).pointer = pyVar16 + 1;
          *pyVar16 = 'b';
          goto LAB_00109879;
        case 9:
          pyVar16 = (emitter->buffer).pointer;
          if ((emitter->buffer).end <= pyVar16 + 5) {
            iVar12 = yaml_emitter_flush(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            pyVar16 = (emitter->buffer).pointer;
          }
          (emitter->buffer).pointer = pyVar16 + 1;
          *pyVar16 = 't';
          goto LAB_00109879;
        case 10:
          pyVar16 = (emitter->buffer).pointer;
          if ((emitter->buffer).end <= pyVar16 + 5) {
            iVar12 = yaml_emitter_flush(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            pyVar16 = (emitter->buffer).pointer;
          }
          (emitter->buffer).pointer = pyVar16 + 1;
          *pyVar16 = 'n';
          goto LAB_00109879;
        case 0xb:
          pyVar16 = (emitter->buffer).pointer;
          if ((emitter->buffer).end <= pyVar16 + 5) {
            iVar12 = yaml_emitter_flush(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            pyVar16 = (emitter->buffer).pointer;
          }
          (emitter->buffer).pointer = pyVar16 + 1;
          *pyVar16 = 'v';
          goto LAB_00109879;
        case 0xc:
          pyVar16 = (emitter->buffer).pointer;
          if ((emitter->buffer).end <= pyVar16 + 5) {
            iVar12 = yaml_emitter_flush(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            pyVar16 = (emitter->buffer).pointer;
          }
          (emitter->buffer).pointer = pyVar16 + 1;
          *pyVar16 = 'f';
          goto LAB_00109879;
        case 0xd:
          pyVar16 = (emitter->buffer).pointer;
          if ((emitter->buffer).end <= pyVar16 + 5) {
            iVar12 = yaml_emitter_flush(emitter);
            if (iVar12 == 0) {
              return 0;
            }
            pyVar16 = (emitter->buffer).pointer;
          }
          (emitter->buffer).pointer = pyVar16 + 1;
          *pyVar16 = 'r';
          goto LAB_00109879;
        default:
          if (uVar23 == 0x1b) {
            pyVar16 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar16 + 5) {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              pyVar16 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar16 + 1;
            *pyVar16 = 'e';
            goto LAB_00109879;
          }
          if (uVar23 == 0x22) {
            pyVar16 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar16 + 5) {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              pyVar16 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar16 + 1;
            *pyVar16 = '\"';
            goto LAB_00109879;
          }
          if (uVar23 == 0x5c) {
            pyVar16 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar16 + 5) {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              pyVar16 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar16 + 1;
            *pyVar16 = '\\';
            goto LAB_00109879;
          }
          if (uVar23 == 0x85) {
            pyVar16 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar16 + 5) {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              pyVar16 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar16 + 1;
            *pyVar16 = 'N';
            goto LAB_00109879;
          }
          if (uVar23 == 0xa0) {
            pyVar16 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar16 + 5) {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              pyVar16 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar16 + 1;
            *pyVar16 = '_';
            goto LAB_00109879;
          }
          if (uVar23 == 0x2028) {
            pyVar16 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar16 + 5) {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              pyVar16 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar16 + 1;
            *pyVar16 = 'L';
            goto LAB_00109879;
          }
          if (uVar23 == 0x2029) {
            pyVar16 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar16 + 5) {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              pyVar16 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar16 + 1;
            *pyVar16 = 'P';
            goto LAB_00109879;
          }
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
          if (uVar23 < 0x100) {
            pyVar16 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar16 + 5) {
              iVar12 = yaml_emitter_flush(emitter);
              if (iVar12 == 0) {
                return 0;
              }
              pyVar16 = (emitter->buffer).pointer;
            }
            (emitter->buffer).pointer = pyVar16 + 1;
            *pyVar16 = 'x';
            iVar12 = 4;
          }
          else {
            pyVar16 = (emitter->buffer).end;
            pyVar15 = (emitter->buffer).pointer;
            if (uVar23 < 0x10000) {
              if (pyVar16 <= pyVar15 + 5) {
                iVar12 = yaml_emitter_flush(emitter);
                if (iVar12 == 0) {
                  return 0;
                }
                pyVar15 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar15 + 1;
              *pyVar15 = 'u';
              iVar12 = 0xc;
            }
            else {
              if (pyVar16 <= pyVar15 + 5) {
                iVar12 = yaml_emitter_flush(emitter);
                if (iVar12 == 0) {
                  return 0;
                }
                pyVar15 = (emitter->buffer).pointer;
              }
              (emitter->buffer).pointer = pyVar15 + 1;
              *pyVar15 = 'U';
              iVar12 = 0x1c;
            }
          }
          emitter->column = emitter->column + 1;
          for (; -1 < iVar12; iVar12 = iVar12 + -4) {
            pyVar16 = (emitter->buffer).pointer;
            if ((emitter->buffer).end <= pyVar16 + 5) {
              iVar13 = yaml_emitter_flush(emitter);
              if (iVar13 == 0) {
                return 0;
              }
              pyVar16 = (emitter->buffer).pointer;
            }
            uVar26 = uVar23 >> ((byte)iVar12 & 0x1f) & 0xf;
            cVar6 = (char)uVar26;
            yVar7 = cVar6 + '0';
            if (9 < uVar26) {
              yVar7 = cVar6 + '7';
            }
            (emitter->buffer).pointer = pyVar16 + 1;
            *pyVar16 = yVar7;
            emitter->column = emitter->column + 1;
          }
          bVar27 = false;
          goto LAB_00108f0a;
        }
      } while( true );
    case YAML_LITERAL_SCALAR_STYLE:
      goto switchD_0010883f_caseD_4;
    case YAML_FOLDED_SCALAR_STYLE:
      pbVar25 = (emitter->scalar_data).value;
      pbVar19 = pbVar25 + (emitter->scalar_data).length;
      bVar27 = false;
      bVar21 = true;
      iVar10 = yaml_emitter_write_indicator(emitter,">",1,0,0);
      if (((iVar10 == 0) ||
          (string.end = pbVar19, string.start = pbVar25, string.pointer = pbVar25,
          iVar10 = yaml_emitter_write_block_scalar_hints(emitter,string), iVar10 == 0)) ||
         (((emitter->buffer).end <= (emitter->buffer).pointer + 5 &&
          (iVar10 = yaml_emitter_flush(emitter), iVar10 == 0)))) goto LAB_0010a6f8;
      yVar1 = emitter->line_break;
      if (yVar1 == YAML_CR_BREAK) {
        yVar7 = '\r';
      }
      else {
        if (yVar1 == YAML_CRLN_BREAK) {
          pyVar16 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar16 + 1;
          *pyVar16 = '\r';
        }
        else if (yVar1 != YAML_LN_BREAK) goto LAB_00109f39;
        yVar7 = '\n';
      }
      pyVar16 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar16 + 1;
      *pyVar16 = yVar7;
LAB_00109f39:
      emitter->column = 0;
      emitter->whitespace = 1;
      emitter->line = emitter->line + 1;
      emitter->indention = 1;
      iVar10 = 1;
LAB_00109f67:
      if (pbVar25 != pbVar19) {
        bVar8 = *pbVar25;
        if (((bVar8 == 10) || (bVar8 == 0xd)) ||
           ((bVar8 != 0xe2 && ((bVar8 == 0xc2 && (pbVar25[1] == 0x85)))))) {
          if ((iVar10 == 0) && ((!bVar21 && (bVar8 == 10)))) {
            uVar20 = 0;
            uVar22 = 10;
            do {
              if ((byte)uVar22 < 0x21) {
                uVar23 = 1;
                if ((0x2400UL >> (uVar22 & 0x3f) & 1) == 0) {
                  if ((0x100000201U >> (uVar22 & 0x3f) & 1) == 0) goto LAB_0010a002;
                  break;
                }
              }
              else {
LAB_0010a002:
                if ((((int)uVar22 == 0xe2) || ((int)uVar22 != 0xc2)) ||
                   (uVar23 = 2, pbVar25[(uVar20 & 0xffffffff) + 1] != 0x85)) goto LAB_0010a149;
              }
              uVar20 = (ulong)uVar23 + (uVar20 & 0xffffffff);
              uVar22 = (ulong)pbVar25[uVar20];
            } while( true );
          }
          goto LAB_0010a259;
        }
        if (iVar10 == 0) {
          if (((bVar8 != 0x20) || (bVar8 = 0x20, pbVar25[1] == 0x20)) ||
             (emitter->column <= emitter->best_width)) goto LAB_0010a0ef;
          iVar10 = yaml_emitter_write_indent(emitter);
          if (iVar10 == 0) goto LAB_0010a6f6;
          bVar8 = *pbVar25;
          lVar18 = 1;
          if ((((char)bVar8 < '\0') && (lVar18 = 2, (bVar8 & 0xe0) != 0xc0)) &&
             (lVar18 = 3, (bVar8 & 0xf0) != 0xe0)) {
            lVar18 = (ulong)((bVar8 & 0xf8) == 0xf0) << 2;
          }
          pbVar25 = pbVar25 + lVar18;
        }
        else {
          iVar10 = yaml_emitter_write_indent(emitter);
          if (iVar10 == 0) goto LAB_0010a6f6;
          bVar8 = *pbVar25;
          bVar21 = bVar8 == 9 || bVar8 == 0x20;
LAB_0010a0ef:
          if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
            iVar10 = yaml_emitter_flush(emitter);
            if (iVar10 == 0) goto LAB_0010a6f6;
            bVar8 = *pbVar25;
          }
          if ((char)bVar8 < '\0') {
            if ((bVar8 & 0xe0) == 0xc0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
              bVar8 = pbVar25[1];
              pbVar25 = pbVar25 + 2;
              goto LAB_0010a20e;
            }
            if ((bVar8 & 0xf0) == 0xe0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
              bVar8 = pbVar25[1];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
              bVar8 = pbVar25[2];
              pbVar25 = pbVar25 + 3;
              goto LAB_0010a20e;
            }
            if ((bVar8 & 0xf8) == 0xf0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
              bVar8 = pbVar25[1];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
              bVar8 = pbVar25[2];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar8;
              bVar8 = pbVar25[3];
              pbVar25 = pbVar25 + 4;
              goto LAB_0010a20e;
            }
          }
          else {
            pbVar25 = pbVar25 + 1;
LAB_0010a20e:
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
          }
          emitter->column = emitter->column + 1;
        }
        iVar10 = 0;
        goto LAB_0010a3c0;
      }
      goto LAB_0010a6f1;
    default:
      return 0;
    }
  case YAML_SEQUENCE_START_EVENT:
    iVar10 = yaml_emitter_process_anchor(emitter);
    if (iVar10 == 0) {
      return 0;
    }
    iVar10 = yaml_emitter_process_tag(emitter);
    if (iVar10 == 0) {
      return 0;
    }
    yVar11 = YAML_EMIT_FLOW_SEQUENCE_FIRST_ITEM_STATE;
    if (((emitter->flow_level != 0) || (emitter->canonical != 0)) ||
       ((event->data).sequence_start.style == YAML_FLOW_SEQUENCE_STYLE)) goto LAB_00108d93;
    iVar10 = yaml_emitter_check_empty_sequence(emitter);
    yVar17 = YAML_EMIT_BLOCK_SEQUENCE_FIRST_ITEM_STATE;
    yVar11 = YAML_EMIT_FLOW_SEQUENCE_FIRST_ITEM_STATE;
    break;
  default:
    emitter->error = YAML_EMITTER_ERROR;
    pcVar14 = "expected SCALAR, SEQUENCE-START, MAPPING-START, or ALIAS";
LAB_00108dab:
    emitter->problem = pcVar14;
    return 0;
  case YAML_MAPPING_START_EVENT:
    iVar10 = yaml_emitter_process_anchor(emitter);
    if (iVar10 == 0) {
      return 0;
    }
    iVar10 = yaml_emitter_process_tag(emitter);
    if (iVar10 == 0) {
      return 0;
    }
    yVar11 = YAML_EMIT_FLOW_MAPPING_FIRST_KEY_STATE;
    if (((emitter->flow_level != 0) || (emitter->canonical != 0)) ||
       ((event->data).sequence_start.style == YAML_FLOW_SEQUENCE_STYLE)) goto LAB_00108d93;
    iVar10 = yaml_emitter_check_empty_mapping(emitter);
    yVar17 = YAML_EMIT_BLOCK_MAPPING_FIRST_KEY_STATE;
    yVar11 = YAML_EMIT_FLOW_MAPPING_FIRST_KEY_STATE;
  }
  if (iVar10 == 0) {
    yVar11 = yVar17;
  }
LAB_00108d93:
  emitter->state = yVar11;
  return 1;
LAB_0010a149:
  if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
     (iVar10 = yaml_emitter_flush(emitter), iVar10 == 0)) goto LAB_0010a6f6;
  yVar1 = emitter->line_break;
  if (yVar1 == YAML_CR_BREAK) {
    yVar7 = '\r';
LAB_0010a23e:
    pyVar16 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar16 + 1;
    *pyVar16 = yVar7;
  }
  else {
    if (yVar1 == YAML_CRLN_BREAK) {
      pyVar16 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar16 + 1;
      *pyVar16 = '\r';
LAB_0010a238:
      yVar7 = '\n';
      goto LAB_0010a23e;
    }
    if (yVar1 == YAML_LN_BREAK) goto LAB_0010a238;
  }
  emitter->column = 0;
  emitter->line = emitter->line + 1;
LAB_0010a259:
  if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
     (iVar10 = yaml_emitter_flush(emitter), iVar10 == 0)) goto LAB_0010a6f6;
  bVar8 = *pbVar25;
  if (bVar8 == 10) {
    if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
       (iVar10 = yaml_emitter_flush(emitter), iVar10 != 0)) {
      yVar1 = emitter->line_break;
      if (yVar1 == YAML_CR_BREAK) {
        yVar7 = '\r';
LAB_0010a2fc:
        pyVar16 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar16 + 1;
        *pyVar16 = yVar7;
      }
      else {
        if (yVar1 == YAML_CRLN_BREAK) {
          pyVar16 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar16 + 1;
          *pyVar16 = '\r';
LAB_0010a2f6:
          yVar7 = '\n';
          goto LAB_0010a2fc;
        }
        if (yVar1 == YAML_LN_BREAK) goto LAB_0010a2f6;
      }
      emitter->column = 0;
      emitter->line = emitter->line + 1;
    }
    pbVar25 = pbVar25 + 1;
    goto LAB_0010a3bd;
  }
  if ((char)bVar8 < '\0') {
    if ((bVar8 & 0xe0) == 0xc0) {
      pbVar4 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar4 + 1;
      *pbVar4 = bVar8;
      bVar8 = pbVar25[1];
      pbVar25 = pbVar25 + 2;
      goto LAB_0010a3a2;
    }
    if ((bVar8 & 0xf0) == 0xe0) {
      pbVar4 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar4 + 1;
      *pbVar4 = bVar8;
      bVar8 = pbVar25[1];
      pbVar4 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar4 + 1;
      *pbVar4 = bVar8;
      bVar8 = pbVar25[2];
      pbVar25 = pbVar25 + 3;
      goto LAB_0010a3a2;
    }
    if ((bVar8 & 0xf8) == 0xf0) {
      pbVar4 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar4 + 1;
      *pbVar4 = bVar8;
      bVar8 = pbVar25[1];
      pbVar4 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar4 + 1;
      *pbVar4 = bVar8;
      bVar8 = pbVar25[2];
      pbVar4 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pbVar4 + 1;
      *pbVar4 = bVar8;
      bVar8 = pbVar25[3];
      pbVar25 = pbVar25 + 4;
      goto LAB_0010a3a2;
    }
  }
  else {
    pbVar25 = pbVar25 + 1;
LAB_0010a3a2:
    pbVar4 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pbVar4 + 1;
    *pbVar4 = bVar8;
  }
  emitter->column = 0;
  emitter->line = emitter->line + 1;
LAB_0010a3bd:
  iVar10 = 1;
LAB_0010a3c0:
  emitter->indention = iVar10;
  goto LAB_00109f67;
LAB_0010a6f6:
  bVar27 = false;
  goto LAB_0010a6f8;
switchD_0010883f_caseD_4:
  pbVar25 = (emitter->scalar_data).value;
  pbVar19 = pbVar25 + (emitter->scalar_data).length;
  bVar27 = false;
  iVar10 = yaml_emitter_write_indicator(emitter,"|",1,0,0);
  if (((iVar10 == 0) ||
      (string_00.end = pbVar19, string_00.start = pbVar25, string_00.pointer = pbVar25,
      iVar10 = yaml_emitter_write_block_scalar_hints(emitter,string_00), iVar10 == 0)) ||
     (((emitter->buffer).end <= (emitter->buffer).pointer + 5 &&
      (iVar10 = yaml_emitter_flush(emitter), iVar10 == 0)))) goto LAB_0010a6f8;
  yVar1 = emitter->line_break;
  if (yVar1 == YAML_CR_BREAK) {
    yVar7 = '\r';
LAB_0010a3e0:
    pyVar16 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar16 + 1;
    *pyVar16 = yVar7;
  }
  else {
    if (yVar1 == YAML_CRLN_BREAK) {
      pyVar16 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar16 + 1;
      *pyVar16 = '\r';
LAB_0010a3da:
      yVar7 = '\n';
      goto LAB_0010a3e0;
    }
    if (yVar1 == YAML_LN_BREAK) goto LAB_0010a3da;
  }
  emitter->column = 0;
  emitter->whitespace = 1;
  emitter->line = emitter->line + 1;
  emitter->indention = 1;
  iVar10 = 1;
  while (pbVar25 != pbVar19) {
    bVar8 = *pbVar25;
    if (((bVar8 == 10) || (bVar8 == 0xd)) ||
       ((bVar8 != 0xe2 && ((bVar8 == 0xc2 && (pbVar25[1] == 0x85)))))) {
      if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
        iVar10 = yaml_emitter_flush(emitter);
        if (iVar10 == 0) goto LAB_0010a6f6;
        bVar8 = *pbVar25;
      }
      if (bVar8 == 10) {
        if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
           (iVar10 = yaml_emitter_flush(emitter), iVar10 != 0)) {
          yVar1 = emitter->line_break;
          if (yVar1 == YAML_CR_BREAK) {
            yVar7 = '\r';
LAB_0010a5c5:
            pyVar16 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar16 + 1;
            *pyVar16 = yVar7;
          }
          else {
            if (yVar1 == YAML_CRLN_BREAK) {
              pyVar16 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar16 + 1;
              *pyVar16 = '\r';
LAB_0010a5bf:
              yVar7 = '\n';
              goto LAB_0010a5c5;
            }
            if (yVar1 == YAML_LN_BREAK) goto LAB_0010a5bf;
          }
          emitter->column = 0;
          emitter->line = emitter->line + 1;
        }
        pbVar25 = pbVar25 + 1;
      }
      else {
        if ((char)bVar8 < '\0') {
          if ((bVar8 & 0xe0) == 0xc0) {
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[1];
            pbVar25 = pbVar25 + 2;
            goto LAB_0010a6c8;
          }
          if ((bVar8 & 0xf0) == 0xe0) {
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[1];
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[2];
            pbVar25 = pbVar25 + 3;
            goto LAB_0010a6c8;
          }
          if ((bVar8 & 0xf8) == 0xf0) {
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[1];
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[2];
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar8;
            bVar8 = pbVar25[3];
            pbVar25 = pbVar25 + 4;
            goto LAB_0010a6c8;
          }
        }
        else {
          pbVar25 = pbVar25 + 1;
LAB_0010a6c8:
          pbVar4 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar4 + 1;
          *pbVar4 = bVar8;
        }
        emitter->column = 0;
        emitter->line = emitter->line + 1;
      }
      iVar10 = 1;
    }
    else {
      if (((iVar10 != 0) && (iVar10 = yaml_emitter_write_indent(emitter), iVar10 == 0)) ||
         (((emitter->buffer).end <= (emitter->buffer).pointer + 5 &&
          (iVar10 = yaml_emitter_flush(emitter), iVar10 == 0)))) goto LAB_0010a6f6;
      bVar8 = *pbVar25;
      if ((char)bVar8 < '\0') {
        if ((bVar8 & 0xe0) == 0xc0) {
          pbVar4 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar4 + 1;
          *pbVar4 = bVar8;
          bVar8 = pbVar25[1];
          pbVar25 = pbVar25 + 2;
          goto LAB_0010a66b;
        }
        if ((bVar8 & 0xf0) == 0xe0) {
          pbVar4 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar4 + 1;
          *pbVar4 = bVar8;
          bVar8 = pbVar25[1];
          pbVar4 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar4 + 1;
          *pbVar4 = bVar8;
          bVar8 = pbVar25[2];
          pbVar25 = pbVar25 + 3;
          goto LAB_0010a66b;
        }
        if ((bVar8 & 0xf8) == 0xf0) {
          pbVar4 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar4 + 1;
          *pbVar4 = bVar8;
          bVar8 = pbVar25[1];
          pbVar4 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar4 + 1;
          *pbVar4 = bVar8;
          bVar8 = pbVar25[2];
          pbVar4 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar4 + 1;
          *pbVar4 = bVar8;
          bVar8 = pbVar25[3];
          pbVar25 = pbVar25 + 4;
          goto LAB_0010a66b;
        }
      }
      else {
        pbVar25 = pbVar25 + 1;
LAB_0010a66b:
        pbVar4 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar4 + 1;
        *pbVar4 = bVar8;
      }
      emitter->column = emitter->column + 1;
      iVar10 = 0;
    }
    emitter->indention = iVar10;
  }
LAB_0010a6f1:
  bVar27 = true;
LAB_0010a6f8:
  if (!bVar27) {
    return 0;
  }
LAB_0010a700:
  pyVar2 = (emitter->states).top;
  piVar5 = (emitter->indents).top;
  (emitter->indents).top = piVar5 + -1;
  emitter->indent = piVar5[-1];
  (emitter->states).top = pyVar2 + -1;
  emitter->state = pyVar2[-1];
  return 1;
}

Assistant:

static int
yaml_emitter_emit_node(yaml_emitter_t *emitter, yaml_event_t *event,
        int root, int sequence, int mapping, int simple_key)
{
    emitter->root_context = root;
    emitter->sequence_context = sequence;
    emitter->mapping_context = mapping;
    emitter->simple_key_context = simple_key;

    switch (event->type)
    {
        case YAML_ALIAS_EVENT:
            return yaml_emitter_emit_alias(emitter, event);

        case YAML_SCALAR_EVENT:
            return yaml_emitter_emit_scalar(emitter, event);

        case YAML_SEQUENCE_START_EVENT:
            return yaml_emitter_emit_sequence_start(emitter, event);

        case YAML_MAPPING_START_EVENT:
            return yaml_emitter_emit_mapping_start(emitter, event);

        default:
            return yaml_emitter_set_emitter_error(emitter,
                    "expected SCALAR, SEQUENCE-START, MAPPING-START, or ALIAS");
    }

    return 0;
}